

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O3

bool __thiscall
MeCab::FeatureIndex::buildBigramFeature
          (FeatureIndex *this,LearnerPath *path,char *rfeature,char *lfeature)

{
  char *pcVar1;
  StringBuffer *this_00;
  byte bVar2;
  pointer piVar3;
  iterator iVar4;
  _func_int ***ppp_Var5;
  _func_int ***ppp_Var6;
  LearnerPath *pLVar7;
  char cVar8;
  size_t sVar9;
  char *pcVar10;
  FeatureIndex *pFVar11;
  ostream *poVar12;
  int *piVar13;
  ulong uVar14;
  size_t sVar15;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *__buf_01;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  char *pcVar16;
  FeatureIndex *pFVar17;
  char *pcVar18;
  FeatureIndex *pFVar19;
  int __fd;
  char *pcVar20;
  FeatureIndex *pFVar21;
  char *pcVar22;
  FeatureIndex *pFVar23;
  pointer ppcVar24;
  char **ppcVar25;
  char *p;
  int id;
  char *local_98;
  int local_8c;
  FeatureIndex *local_88;
  FeatureIndex *local_80;
  char **local_78;
  char **local_70;
  size_t local_68;
  size_t local_60;
  char *local_58;
  LearnerPath *local_50;
  FeatureIndex *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = rfeature;
  local_38 = lfeature;
  local_88 = (FeatureIndex *)operator_new__(0x800);
  local_58 = (char *)operator_new__(0x800);
  local_78 = (char **)operator_new__(0x200);
  local_70 = (char **)operator_new__(0x200);
  pcVar22 = local_58;
  piVar3 = (this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar3) {
    (this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  local_80 = this;
  local_50 = path;
  strncpy(local_58,local_40,0x800);
  strncpy((char *)local_88,local_38,0x800);
  sVar9 = strlen(pcVar22);
  if ((long)sVar9 < 1) {
    local_60 = 0;
    sVar15 = local_60;
  }
  else {
    pcVar16 = pcVar22 + sVar9;
    local_60 = 0;
    ppcVar25 = local_70;
    uVar14 = 0x40;
    do {
      for (; (cVar8 = *pcVar22, cVar8 == '\t' || (cVar8 == ' ')); pcVar22 = pcVar22 + 1) {
      }
      if (cVar8 == '\"') {
        pcVar22 = pcVar22 + 1;
        pcVar18 = pcVar22;
        for (pcVar10 = pcVar22;
            (pcVar20 = pcVar10, pcVar10 < pcVar16 &&
            ((cVar8 = *pcVar10, cVar8 != '\"' ||
             (pcVar20 = pcVar10 + 1, pcVar1 = pcVar10 + 1, pcVar10 = pcVar20, *pcVar1 == '\"'))));
            pcVar10 = pcVar10 + 1) {
          *pcVar18 = cVar8;
          pcVar18 = pcVar18 + 1;
        }
        local_98 = (char *)CONCAT71(local_98._1_7_,0x2c);
        pcVar10 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (pcVar20,pcVar16,&stack0xffffffffffffff68);
      }
      else {
        local_98 = (char *)CONCAT71(local_98._1_7_,0x2c);
        pcVar10 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (pcVar22,pcVar16,&stack0xffffffffffffff68);
        pcVar18 = pcVar10;
      }
      if (uVar14 < 2) {
        *ppcVar25 = pcVar22;
        sVar15 = local_60 + 1;
        if (uVar14 - 1 == 0) break;
      }
      else {
        *pcVar18 = '\0';
        *ppcVar25 = pcVar22;
      }
      local_60 = local_60 + 1;
      ppcVar25 = ppcVar25 + 1;
      pcVar22 = pcVar10 + 1;
      sVar15 = local_60;
      uVar14 = uVar14 - 1;
    } while (pcVar22 < pcVar16);
  }
  local_60 = sVar15;
  pFVar23 = local_88;
  pFVar21 = local_88;
  sVar9 = strlen((char *)local_88);
  if ((long)sVar9 < 1) {
    local_68 = 0;
    __buf = extraout_RDX;
    sVar15 = local_68;
  }
  else {
    pFVar17 = (FeatureIndex *)((long)&pFVar23->_vptr_FeatureIndex + sVar9);
    local_68 = 0;
    ppcVar25 = local_78;
    uVar14 = 0x40;
    do {
      for (; (cVar8 = *(char *)&pFVar23->_vptr_FeatureIndex, cVar8 == '\t' || (cVar8 == ' '));
          pFVar23 = (FeatureIndex *)((long)&pFVar23->_vptr_FeatureIndex + 1)) {
      }
      if (cVar8 == '\"') {
        pFVar23 = (FeatureIndex *)((long)&pFVar23->_vptr_FeatureIndex + 1);
        pFVar19 = pFVar23;
        for (pFVar11 = pFVar23;
            (pFVar21 = pFVar11, pFVar11 < pFVar17 &&
            ((ppp_Var5 = &pFVar11->_vptr_FeatureIndex, *(char *)ppp_Var5 != '\"' ||
             (pFVar21 = (FeatureIndex *)((long)&pFVar11->_vptr_FeatureIndex + 1),
             ppp_Var6 = &pFVar11->_vptr_FeatureIndex, pFVar11 = pFVar21,
             *(char *)((long)ppp_Var6 + 1) == '\"'))));
            pFVar11 = (FeatureIndex *)((long)&pFVar11->_vptr_FeatureIndex + 1)) {
          *(char *)&pFVar19->_vptr_FeatureIndex = *(char *)ppp_Var5;
          pFVar19 = (FeatureIndex *)((long)&pFVar19->_vptr_FeatureIndex + 1);
        }
        local_98 = (char *)CONCAT71(local_98._1_7_,0x2c);
        pFVar11 = (FeatureIndex *)
                  std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (pFVar21,pFVar17,&stack0xffffffffffffff68);
        __buf = extraout_RDX_00;
      }
      else {
        local_98 = (char *)CONCAT71(local_98._1_7_,0x2c);
        pFVar21 = pFVar23;
        pFVar11 = (FeatureIndex *)
                  std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (pFVar23,pFVar17,&stack0xffffffffffffff68);
        __buf = extraout_RDX_01;
        pFVar19 = pFVar11;
      }
      if (uVar14 < 2) {
        *ppcVar25 = (char *)pFVar23;
        sVar15 = local_68 + 1;
        if (uVar14 - 1 == 0) break;
      }
      else {
        *(char *)&pFVar19->_vptr_FeatureIndex = '\0';
        *ppcVar25 = (char *)pFVar23;
      }
      local_68 = local_68 + 1;
      ppcVar25 = ppcVar25 + 1;
      pFVar23 = (FeatureIndex *)((long)&pFVar11->_vptr_FeatureIndex + 1);
      sVar15 = local_68;
      uVar14 = uVar14 - 1;
    } while (pFVar23 < pFVar17);
  }
  local_68 = sVar15;
  local_48 = (FeatureIndex *)&local_80->feature_;
  ppcVar24 = (local_80->bigram_templs_).
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppcVar24 ==
      (local_80->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
LAB_001406ac:
    pFVar21 = local_80;
    local_98 = (char *)CONCAT44(local_98._4_4_,0xffffffff);
    iVar4._M_current =
         (local_80->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (local_80->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)local_48,iVar4,(int *)&stack0xffffffffffffff68
                );
      piVar13 = (pFVar21->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    else {
      *iVar4._M_current = -1;
      piVar13 = iVar4._M_current + 1;
      (local_80->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar13;
    }
    pLVar7 = local_50;
    piVar13 = ChunkFreeList<int>::alloc
                        (&pFVar21->feature_freelist_,
                         (long)piVar13 -
                         (long)(pFVar21->feature_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2);
    pLVar7->fvector = piVar13;
    piVar3 = (pFVar21->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar9 = (long)(pFVar21->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar3;
    if (sVar9 != 0) {
      memmove(piVar13,piVar3,sVar9);
      piVar3 = (pFVar21->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pFVar21->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar3) {
        (pFVar21->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar3;
      }
    }
    operator_delete__(local_70);
    operator_delete__(local_78);
    operator_delete__(local_58);
    operator_delete__(local_88);
    return true;
  }
  this_00 = &local_80->os_;
LAB_0014041f:
  pcVar22 = *ppcVar24;
  (local_80->os_).size_ = 0;
  do {
    cVar8 = *pcVar22;
    if (cVar8 == '%') {
      pcVar16 = pcVar22 + 1;
      bVar2 = pcVar22[1];
      local_98 = pcVar16;
      if (bVar2 < 0x6c) {
        if (bVar2 == 0x4c) {
          sVar15 = local_60;
          pcVar22 = getIndex(pFVar21,&stack0xffffffffffffff68,local_70,local_60);
          __buf = __buf_01;
          if (pcVar22 == (char *)0x0) goto LAB_00140696;
          pFVar21 = (FeatureIndex *)this_00;
          StringBuffer::write(this_00,(int)pcVar22,__buf_01,sVar15);
          __buf = extraout_RDX_06;
        }
        else {
          if (bVar2 != 0x52) goto LAB_00140523;
          sVar15 = local_68;
          pcVar22 = getIndex(pFVar21,&stack0xffffffffffffff68,local_78,local_68);
          __buf = __buf_00;
          if (pcVar22 == (char *)0x0) goto LAB_00140696;
          pFVar21 = (FeatureIndex *)this_00;
          StringBuffer::write(this_00,(int)pcVar22,__buf_00,sVar15);
          __buf = extraout_RDX_03;
        }
      }
      else {
        __fd = (int)local_38;
        if ((bVar2 == 0x6c) || (__fd = (int)local_40, bVar2 == 0x72)) {
          pFVar21 = (FeatureIndex *)this_00;
          StringBuffer::write(this_00,__fd,__buf,(size_t)pcVar22);
          __buf = extraout_RDX_04;
        }
        else {
LAB_00140523:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1a3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"false",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"unknown meta char: ",0x13);
          local_8c = CONCAT31(local_8c._1_3_,*pcVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,(char *)&stack0xffffffffffffff74,1);
          pFVar21 = (FeatureIndex *)&stack0xffffffffffffff67;
          die::~die((die *)pFVar21);
          __buf = extraout_RDX_05;
        }
      }
    }
    else {
      if (cVar8 == '\\') {
        local_98 = pcVar22 + 1;
        bVar2 = pcVar22[1];
        pcVar22 = (char *)(ulong)bVar2;
        cVar8 = '\0';
        if (bVar2 < 0x66) {
          if (bVar2 == 0x5c) {
            cVar8 = '\\';
          }
          else if (bVar2 == 0x61) {
            cVar8 = '\a';
          }
          else if (bVar2 == 0x62) {
            cVar8 = '\b';
          }
        }
        else {
          __buf = (void *)(ulong)(bVar2 - 0x6e);
          if (bVar2 - 0x6e < 9) {
            pcVar22 = (char *)((long)&switchD_0014048d::switchdataD_0015c8a4 +
                              (long)(int)(&switchD_0014048d::switchdataD_0015c8a4)[(long)__buf]);
            switch(__buf) {
            case (void *)0x0:
              cVar8 = '\n';
              break;
            case (void *)0x4:
              cVar8 = '\r';
              break;
            case (void *)0x5:
              cVar8 = ' ';
              break;
            case (void *)0x6:
              cVar8 = '\t';
              break;
            case (void *)0x8:
              cVar8 = '\v';
            }
          }
          else if (bVar2 == 0x66) {
            cVar8 = '\f';
          }
        }
      }
      else {
        local_98 = pcVar22;
        if (cVar8 == '\0') break;
      }
      pFVar21 = (FeatureIndex *)this_00;
      StringBuffer::write(this_00,(int)cVar8,__buf,(size_t)pcVar22);
      __buf = extraout_RDX_02;
    }
    pcVar22 = local_98 + 1;
  } while( true );
  StringBuffer::write(this_00,0,__buf,(size_t)pcVar22);
  pFVar21 = local_80;
  local_8c = (*local_80->_vptr_FeatureIndex[6])();
  __buf = extraout_RDX_07;
  if (local_8c != -1) {
    iVar4._M_current =
         (local_80->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (local_80->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      pFVar21 = local_48;
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)local_48,iVar4,&stack0xffffffffffffff74);
      __buf = extraout_RDX_08;
    }
    else {
      *iVar4._M_current = local_8c;
      (local_80->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
  }
LAB_00140696:
  ppcVar24 = ppcVar24 + 1;
  if (ppcVar24 ==
      (local_80->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) goto LAB_001406ac;
  goto LAB_0014041f;
}

Assistant:

bool FeatureIndex::buildBigramFeature(LearnerPath *path,
                                      const char *rfeature,
                                      const char *lfeature) {
  scoped_fixed_array<char, BUFSIZE> rbuf;
  scoped_fixed_array<char, BUFSIZE> lbuf;
  scoped_fixed_array<char *, POSSIZE> R;
  scoped_fixed_array<char *, POSSIZE> L;

  feature_.clear();
  std::strncpy(lbuf.get(),  rfeature, lbuf.size());
  std::strncpy(rbuf.get(),  lfeature, rbuf.size());

  const size_t lsize = tokenizeCSV(lbuf.get(), L.get(), L.size());
  const size_t rsize = tokenizeCSV(rbuf.get(), R.get(), R.size());

  for (std::vector<const char*>::const_iterator it = bigram_templs_.begin();
       it != bigram_templs_.end(); ++it) {
    const char *p = *it;
    os_.clear();

    for (; *p; p++) {
      switch (*p) {
        default: os_ << *p; break;
        case '\\': os_ << getEscapedChar(*++p); break;
        case '%': {
          switch (*++p) {
            case 'L': {
              const char *r = getIndex(const_cast<char **>(&p), L.get(), lsize);
              if (!r) goto NEXT;
              os_ << r;
            } break;
            case 'R': {
              const char *r = getIndex(const_cast<char **>(&p), R.get(), rsize);
              if (!r) goto NEXT;
              os_ << r;
            } break;
            case 'l':  os_ << lfeature; break;  // use lfeature as it is
            case 'r':  os_ << rfeature; break;
            default:
              CHECK_DIE(false) << "unknown meta char: " <<  *p;
          }
        }
      }
    }

    os_ << '\0';

    ADDB(os_.str());

 NEXT: continue;
  }

  COPY_FEATURE(path->fvector);

  return true;
}